

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void ModulusHelper<char,signed_char,0>::
     ModulusThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *t,char *u,char *result)

{
  bool bVar1;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  
  if (*in_RSI == '\0') {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
  }
  bVar1 = mod_corner_case<signed_char,_true>::is_undefined(*in_RSI);
  if (bVar1) {
    *in_RDX = '\0';
  }
  else {
    *in_RDX = *in_RDI % *in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }